

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
Intersect<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
              vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer piVar3;
  iterator iVar4;
  int *x;
  pointer piVar5;
  int *x_2;
  vector<int,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> sB;
  set<int,_std::less<int>,_std::allocator<int>_> sA;
  set<int,_std::less<int>,_std::allocator<int>_> s;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_c0._M_impl.super__Rb_tree_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar3 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar5 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_90
               ,piVar5);
  }
  piVar3 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar5 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_c0
               ,piVar5);
  }
  piVar3 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar5 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_90,piVar5);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&local_c0,piVar5);
      if ((_Rb_tree_header *)iVar4._M_node != p_Var2) {
        std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,piVar5);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,piVar5);
      }
    }
  }
  piVar3 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar5 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_90,piVar5);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&local_c0,piVar5);
      if ((_Rb_tree_header *)iVar4._M_node != p_Var2) {
        iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                find(&local_60,piVar5);
        if ((_Rb_tree_header *)iVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
          std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,piVar5);
        }
      }
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

vector<T> Intersect(const vector<T> &A, const vector<T> &B) {
    vector<T> v;
    set<T> s;
    set<T> sA;
    set<T> sB;
    for (auto &x : A) {
        sA.insert(x);
    }
    for (auto &x : B) {
        sB.insert(x);
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end()) {
            v.emplace_back(x);
            s.insert(x);
        }
    }
    for (auto &x : A) {
        if (sA.find(x) != sA.end() && sB.find(x) != sB.end() && s.find(x) == s.end()) {
            v.emplace_back(x);
        }
    }
    return v;
}